

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

TSParser * ts_parser_new(void)

{
  TSParser *self;
  Stack *pSVar1;
  SubtreePool local_38;
  
  self = (TSParser *)ts_calloc(1,0x5c8);
  ts_lexer_init((Lexer *)self);
  (self->reduce_actions).contents = (ReduceAction *)0x0;
  (self->reduce_actions).size = 0;
  (self->reduce_actions).capacity = 0;
  array__reserve((VoidArray *)&self->reduce_actions,0x10,4);
  ts_subtree_pool_new(&local_38,0x20);
  (self->tree_pool).tree_stack.contents = local_38.tree_stack.contents;
  (self->tree_pool).tree_stack.size = local_38.tree_stack.size;
  (self->tree_pool).tree_stack.capacity = local_38.tree_stack.capacity;
  (self->tree_pool).free_trees.contents = local_38.free_trees.contents;
  (self->tree_pool).free_trees.size = local_38.free_trees.size;
  (self->tree_pool).free_trees.capacity = local_38.free_trees.capacity;
  pSVar1 = ts_stack_new(&self->tree_pool);
  self->stack = pSVar1;
  (self->finished_tree).ptr = (SubtreeHeapData *)0x0;
  (self->reusable_node).stack.contents = (StackEntry *)0x0;
  (self->reusable_node).stack.size = 0;
  (self->reusable_node).stack.capacity = 0;
  (self->reusable_node).last_external_token.ptr = (SubtreeHeapData *)0x0;
  self->dot_graph_file = (FILE *)0x0;
  self->halt_on_error = false;
  self->enabled = true;
  self->operation_limit = 0xffffffffffffffff;
  (self->old_tree).ptr = (SubtreeHeapData *)0x0;
  (self->scratch_tree).ptr = &self->scratch_tree_data;
  (self->included_range_differences).contents = (TSRange *)0x0;
  (self->included_range_differences).size = 0;
  (self->included_range_differences).capacity = 0;
  self->included_range_difference_index = 0;
  ts_parser__set_cached_token(self,0,(Subtree)0x0,(Subtree)0x0);
  return self;
}

Assistant:

TSParser *ts_parser_new() {
  TSParser *self = ts_calloc(1, sizeof(TSParser));
  ts_lexer_init(&self->lexer);
  array_init(&self->reduce_actions);
  array_reserve(&self->reduce_actions, 4);
  self->tree_pool = ts_subtree_pool_new(32);
  self->stack = ts_stack_new(&self->tree_pool);
  self->finished_tree = NULL_SUBTREE;
  self->reusable_node = reusable_node_new();
  self->dot_graph_file = NULL;
  self->halt_on_error = false;
  self->enabled = true;
  self->operation_limit = SIZE_MAX;
  self->old_tree = NULL_SUBTREE;
  self->scratch_tree.ptr = &self->scratch_tree_data;
  self->included_range_differences = (TSRangeArray) array_new();
  self->included_range_difference_index = 0;
  ts_parser__set_cached_token(self, 0, NULL_SUBTREE, NULL_SUBTREE);
  return self;
}